

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::Texture(Texture *this,Texture *copy)

{
  bool bVar1;
  Uint64 UVar2;
  Vector2u VVar3;
  ostream *poVar4;
  uint uStack_30;
  uint local_2c;
  Texture *copy_local;
  Texture *this_local;
  
  GlResource::GlResource((GlResource *)this);
  Vector2<unsigned_int>::Vector2(&this->m_size,0,0);
  Vector2<unsigned_int>::Vector2(&this->m_actualSize,0,0);
  this->m_texture = 0;
  this->m_isSmooth = (bool)(copy->m_isSmooth & 1);
  this->m_sRgb = (bool)(copy->m_sRgb & 1);
  this->m_isRepeated = (bool)(copy->m_isRepeated & 1);
  this->m_pixelsFlipped = false;
  this->m_fboAttachment = false;
  this->m_hasMipmap = false;
  UVar2 = anon_unknown.dwarf_d70e4::getUniqueId();
  this->m_cacheId = UVar2;
  if (copy->m_texture != 0) {
    VVar3 = getSize(copy);
    local_2c = VVar3.x;
    VVar3 = getSize(copy);
    uStack_30 = VVar3.y;
    bVar1 = create(this,local_2c,uStack_30);
    if (bVar1) {
      update(this,copy);
      glFlush();
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x62,"glFlush()");
    }
    else {
      poVar4 = err();
      poVar4 = std::operator<<(poVar4,"Failed to copy texture, failed to create new texture");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

Texture::Texture(const Texture& copy) :
m_size         (0, 0),
m_actualSize   (0, 0),
m_texture      (0),
m_isSmooth     (copy.m_isSmooth),
m_sRgb         (copy.m_sRgb),
m_isRepeated   (copy.m_isRepeated),
m_pixelsFlipped(false),
m_fboAttachment(false),
m_hasMipmap    (false),
m_cacheId      (getUniqueId())
{
    if (copy.m_texture)
    {
        if (create(copy.getSize().x, copy.getSize().y))
        {
            update(copy);

            // Force an OpenGL flush, so that the texture will appear updated
            // in all contexts immediately (solves problems in multi-threaded apps)
            glCheck(glFlush());
        }
        else
        {
            err() << "Failed to copy texture, failed to create new texture" << std::endl;
        }
    }
}